

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

string * __thiscall
soul::TokenType::getDescription_abi_cxx11_(string *__return_storage_ptr__,TokenType *this)

{
  char *__s;
  allocator<char> local_31;
  string local_30;
  
  __s = this->text;
  if (*__s == '$') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s + 1,&local_31);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
    choc::text::addDoubleQuotes(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription() const
    {
        return text[0] == '$' ? std::string (text + 1)
                              : choc::text::addDoubleQuotes (text);
    }